

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_count.hpp
# Opt level: O0

void __thiscall
optimization::ref_count::Ref_Count::DFS
          (Ref_Count *this,BasicBlk *startblk,
          set<int,_std::less<int>,_std::allocator<int>_> *visited,int pri,int next_pri)

{
  bool bVar1;
  size_type sVar2;
  pointer pIVar3;
  VarId *other;
  int *piVar4;
  mapped_type *pmVar5;
  int in_ECX;
  BasicBlk *in_RDX;
  Ref_Count *in_RSI;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RDI;
  int in_R8D;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  int bb_false_next_pri;
  int bb_true_next_pri;
  int bb_false_pri;
  int bb_true_pri;
  JumpInstruction *jump;
  VarId var;
  iterator __end3;
  iterator __begin3;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range3;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range2;
  VarId *in_stack_fffffffffffffeb8;
  VarId *in_stack_fffffffffffffec0;
  key_type *in_stack_fffffffffffffec8;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffed0;
  value_type_conflict3 *in_stack_fffffffffffffed8;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  _Base_ptr local_f0;
  undefined1 local_e8;
  char *local_d0;
  value_type_conflict3 local_a8 [8];
  _Self local_88;
  _Self local_80;
  undefined1 local_78 [48];
  undefined1 *local_48;
  reference local_40;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_38;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_30;
  string *psVar7;
  int iVar8;
  
  sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if (sVar2 == 0) {
    psVar7 = &in_RSI[1].name;
    local_30._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)in_stack_fffffffffffffeb8);
    local_38 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)in_stack_fffffffffffffeb8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffffec0,
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffffeb8), bVar1) {
      local_40 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                 ::operator*(&local_30);
      pIVar3 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x1a38fd);
      (*(pIVar3->super_Displayable)._vptr_Displayable[2])(local_78);
      local_48 = local_78;
      local_80._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_fffffffffffffeb8);
      local_88._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffffeb8);
      while (bVar1 = std::operator!=(&local_80,&local_88), bVar1) {
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1a3980);
        mir::inst::VarId::VarId(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        std::
        __shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a39a1);
        in_stack_fffffffffffffed8 = local_a8;
        mir::inst::VarId::VarId(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        Env::add_priority((Env *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0);
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_fffffffffffffec0);
      }
      std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
      ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
           0x1a396e);
      in_stack_fffffffffffffec0 =
           (VarId *)std::
                    __shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1a3a1b);
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1a3a2d);
      mir::inst::VarId::VarId(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      Env::add_priority((Env *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_30);
    }
    local_d0 = in_RSI[1].name.field_2._M_local_buf + 8;
    bVar1 = std::optional<mir::inst::VarId>::has_value((optional<mir::inst::VarId> *)0x1a3a8b);
    local_f8 = in_ECX;
    if (bVar1) {
      other = (VarId *)std::
                       __shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1a3a9d);
      std::optional<mir::inst::VarId>::value
                ((optional<mir::inst::VarId> *)in_stack_fffffffffffffec0);
      mir::inst::VarId::VarId(in_stack_fffffffffffffec0,other);
      Env::add_priority((Env *)in_stack_fffffffffffffec0,other,0);
      local_f8 = in_ECX;
    }
    pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (in_RDI,in_stack_fffffffffffffed8);
    local_f0 = (_Base_ptr)pVar6.first._M_node;
    local_e8 = pVar6.second;
    local_fc = -1;
    local_100 = -1;
    if (*(int *)&in_RSI[2].name.field_2 == 2) {
      local_104 = local_f8 * (int)(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      piVar4 = std::min<int>(&local_104,
                             (int *)((long)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header.
                                            _M_node_count + 4));
      local_f4 = *piVar4;
      local_108 = local_f8 / (int)(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      iVar8 = local_f8;
      piVar4 = std::max<int>(&local_108,(int *)(in_RDI + 1));
      local_f8 = *piVar4;
    }
    else {
      iVar8 = local_f8;
      if (*(int *)(local_d0 + 0x30) == 1) {
        local_10c = local_f8 / 2;
        piVar4 = std::max<int>(&local_10c,(int *)(in_RDI + 1));
        local_f4 = *piVar4;
        if (*(int *)(local_d0 + 0x2c) != -1) {
          std::
          __shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a3bd5);
          pmVar5 = std::
                   map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                   ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                         *)in_RDI,in_stack_fffffffffffffed8);
          if ((pmVar5->jump).jump_kind == Undefined) {
            local_110 = iVar8 / 2;
            piVar4 = std::max<int>(&local_110,(int *)(in_RDI + 1));
            local_f8 = *piVar4;
            local_114 = iVar8 << 1;
            piVar4 = std::min<int>(&local_114,
                                   (int *)((long)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header.
                                                  _M_node_count + 4));
            local_fc = *piVar4;
            local_118 = iVar8 << 1;
            piVar4 = std::min<int>(&local_118,
                                   (int *)((long)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header.
                                                  _M_node_count + 4));
            local_100 = *piVar4;
          }
        }
      }
      else {
        local_f4 = local_f8;
        if ((*(int *)(local_d0 + 8) == 3) && (local_f4 = local_f8, in_R8D != -1)) {
          local_f4 = in_R8D;
        }
      }
    }
    if (*(int *)(local_d0 + 0x28) != -1) {
      std::
      __shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a3ca8);
      std::
      map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
      ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            *)in_RDI,in_stack_fffffffffffffed8);
      DFS(in_RSI,in_RDX,(set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(iVar8,in_R8D),
          (int)((ulong)psVar7 >> 0x20),(int)psVar7);
    }
    if (*(int *)(local_d0 + 0x2c) != -1) {
      std::
      __shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<optimization::ref_count::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a3cf3);
      std::
      map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
      ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            *)in_RDI,in_stack_fffffffffffffed8);
      DFS(in_RSI,in_RDX,(set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(iVar8,in_R8D),
          (int)((ulong)psVar7 >> 0x20),(int)psVar7);
    }
  }
  return;
}

Assistant:

void DFS(mir::inst::BasicBlk& startblk,
           std::set<mir::types::LabelId>& visited, int pri, int next_pri = -1) {
    if (visited.count(startblk.id)) {
      return;
    }
    for (auto& inst : startblk.inst) {
      for (auto var : inst->useVars()) {
        env->add_priority(var, pri);
      }
      env->add_priority(inst->dest, pri);
    }
    auto& jump = startblk.jump;
    if (jump.cond_or_ret.has_value()) {
      env->add_priority(jump.cond_or_ret.value(), pri);
    }
    visited.insert(startblk.id);
    int bb_true_pri = pri;
    int bb_false_pri = pri;
    int bb_true_next_pri = -1;
    int bb_false_next_pri = -1;
    if (startblk.jump.jump_kind == mir::inst::JumpKind::Loop) {
      bb_true_pri = std::min(pri * loop_weight, max_weight);
      bb_false_pri = std::max(pri / loop_weight, min_weight);
    } else if (jump.jump_kind == mir::inst::JumpKind::Branch) {
      bb_true_pri = std::max(pri / 2, min_weight);
      if (jump.bb_false != -1 &&
          env->func.basic_blks.at(jump.bb_false).jump.jump_kind ==
              mir::inst::JumpKind::Undefined) {
        bb_false_pri = std::max(pri / 2, min_weight);
        bb_true_next_pri = std::min(2 * pri, max_weight);
        bb_false_next_pri = std::min(2 * pri, max_weight);
      }
    } else {
      if (jump.kind == mir::inst::JumpInstructionKind::Br && next_pri != -1) {
        bb_true_pri = next_pri;
      }
    }
    if (jump.bb_true != -1) {
      DFS(env->func.basic_blks.at(jump.bb_true), visited, bb_true_pri);
    }
    if (jump.bb_false != -1) {
      DFS(env->func.basic_blks.at(jump.bb_false), visited, bb_false_pri);
    }
  }